

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O0

timestamp_t duckdb::Cast::Operation<long,duckdb::timestamp_t>(long input)

{
  bool bVar1;
  string *msg;
  bool unaff_retaddr;
  timestamp_t *in_stack_00000008;
  long in_stack_00000010;
  timestamp_t result;
  long in_stack_000001a8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffc4;
  int64_t local_8;
  
  bVar1 = TryCast::Operation<long,duckdb::timestamp_t>
                    (in_stack_00000010,in_stack_00000008,unaff_retaddr);
  if (!bVar1) {
    uVar2 = CONCAT13(1,(int3)in_stack_ffffffffffffffc0);
    msg = (string *)__cxa_allocate_exception(0x10);
    CastExceptionText<long,duckdb::timestamp_t>(in_stack_000001a8);
    InvalidInputException::InvalidInputException
              ((InvalidInputException *)CONCAT44(in_stack_ffffffffffffffc4,uVar2),msg);
    __cxa_throw(msg,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException);
  }
  return (timestamp_t)local_8;
}

Assistant:

static inline DST Operation(SRC input) {
		DST result;
		if (!TryCast::Operation(input, result)) {
			throw InvalidInputException(CastExceptionText<SRC, DST>(input));
		}
		return result;
	}